

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O0

int qc_socket_nagle_onoff(QcSocket *socket,int onoff)

{
  int iVar1;
  int local_20;
  int ret;
  int flag;
  int onoff_local;
  QcSocket *socket_local;
  
  ret = onoff;
  _flag = socket;
  if ((socket == (QcSocket *)0x0) &&
     (fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0x65), _flag == (QcSocket *)0x0)) {
    __assert_fail("socket",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0x65,"int qc_socket_nagle_onoff(QcSocket *, int)");
  }
  local_20 = ret;
  iVar1 = setsockopt(_flag->sockfd,6,1,&local_20,4);
  if (iVar1 == -1) {
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0x6b,"couldn\'t setsockopt(TCP_NODELAY)\n");
    socket_local._4_4_ = -1;
  }
  else {
    socket_local._4_4_ = 0;
  }
  return socket_local._4_4_;
}

Assistant:

int qc_socket_nagle_onoff(QcSocket *socket, int onoff)
{
    int flag, ret;

    qc_assert(socket);

    flag = onoff;
    ret = setsockopt(socket->sockfd, IPPROTO_TCP, TCP_NODELAY, (char *)&flag, sizeof(flag));

    if(ret == -1){
        qc_error("couldn't setsockopt(TCP_NODELAY)\n");
        return -1;
    }

    return 0;
}